

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_weapons.cpp
# Opt level: O3

void P_WriteDemoWeaponsChunk(BYTE **demo)

{
  ulong uVar1;
  
  WriteWord((short)Weapons_ntoh.Count,demo);
  if (1 < Weapons_ntoh.Count) {
    uVar1 = 1;
    do {
      WriteString(FName::NameData.NameArray
                  [(Weapons_ntoh.Array[uVar1]->super_PClassInventory).super_PClassActor.super_PClass
                   .super_PNativeStruct.super_PStruct.super_PNamedType.TypeName.Index].Text,demo);
      uVar1 = uVar1 + 1;
    } while (uVar1 < Weapons_ntoh.Count);
  }
  return;
}

Assistant:

void P_WriteDemoWeaponsChunk(BYTE **demo)
{
	WriteWord(Weapons_ntoh.Size(), demo);
	for (unsigned int i = 1; i < Weapons_ntoh.Size(); ++i)
	{
		WriteString(Weapons_ntoh[i]->TypeName.GetChars(), demo);
	}
}